

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_particle.cpp
# Opt level: O3

void __thiscall PP_particle::PP_particle(PP_particle *this,PP_particle *p)

{
  double dVar1;
  PP_COORD local_40;
  PP_COORD local_28;
  
  PP_object::PP_object(&this->super_PP_object);
  (this->super_PP_object)._vptr_PP_object = (_func_int **)&PTR_force_00115d08;
  PP_COORD::operator=(&local_28,&(this->super_PP_object).coord,&(p->super_PP_object).coord);
  PP_COORD::operator=(&local_40,&(this->super_PP_object).v,&(p->super_PP_object).v);
  (this->super_PP_object).R = (p->super_PP_object).R;
  dVar1 = p->e;
  this->m = p->m;
  this->e = dVar1;
  return;
}

Assistant:

PP_particle::PP_particle(PP_particle &p)
{
    coord=p.coord;
    v=p.v;
    R=p.R;
    m=p.m;
    e=p.e;
}